

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O0

void Wln_WriteVerIntVec(FILE *pFile,Wln_Ntk_t *p,Vec_Int_t *vVec,int Start)

{
  int iVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  int local_40;
  int iObj;
  int i;
  int AddedLength;
  int NameCounter;
  int LineLength;
  char *pName;
  int Start_local;
  Vec_Int_t *vVec_local;
  Wln_Ntk_t *p_local;
  FILE *pFile_local;
  
  i = 0;
  AddedLength = Start;
  for (local_40 = 0; iVar1 = Vec_IntSize(vVec), local_40 < iVar1; local_40 = local_40 + 1) {
    iVar1 = Vec_IntEntry(vVec,local_40);
    __s = Wln_ObjName(p,iVar1);
    sVar3 = strlen(__s);
    iVar1 = (int)sVar3 + 2;
    if ((i != 0) && (0x46 < AddedLength + iVar1 + 3)) {
      fprintf((FILE *)pFile,"\n   ");
      i = 0;
      AddedLength = Start;
    }
    iVar2 = Vec_IntSize(vVec);
    pcVar4 = ",";
    if (local_40 == iVar2 + -1) {
      pcVar4 = "";
    }
    fprintf((FILE *)pFile," %s%s",__s,pcVar4);
    AddedLength = iVar1 + AddedLength;
    i = i + 1;
  }
  return;
}

Assistant:

void Wln_WriteVerIntVec( FILE * pFile, Wln_Ntk_t * p, Vec_Int_t * vVec, int Start )
{
    char * pName;
    int LineLength  = Start;
    int NameCounter = 0;
    int AddedLength, i, iObj;
    Vec_IntForEachEntry( vVec, iObj, i )
    {
        pName = Wln_ObjName( p, iObj );
        // get the line length after this name is written
        AddedLength = strlen(pName) + 2;
        if ( NameCounter && LineLength + AddedLength + 3 > 70 )
        { // write the line extender
            fprintf( pFile, "\n   " );
            // reset the line length
            LineLength  = Start;
            NameCounter = 0;
        }
        fprintf( pFile, " %s%s", pName, (i==Vec_IntSize(vVec)-1)? "" : "," );
        LineLength += AddedLength;
        NameCounter++;
    }
}